

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O1

SQRESULT sq_gettypetag(HSQUIRRELVM v,SQInteger idx,SQUserPointer *typetag)

{
  HSQOBJECT *o;
  SQRESULT SVar1;
  
  if (idx < 0) {
    o = &SQVM::GetUp(v,idx)->super_SQObject;
  }
  else {
    o = &SQVM::GetAt(v,idx + v->_stackbase + -1)->super_SQObject;
  }
  SVar1 = sq_getobjtypetag(o,typetag);
  return SVar1 >> 0x3f;
}

Assistant:

SQRESULT sq_gettypetag(HSQUIRRELVM v,SQInteger idx,SQUserPointer *typetag)
{
    SQObjectPtr &o = stack_get(v,idx);
    if (SQ_FAILED(sq_getobjtypetag(&o, typetag)))
        return SQ_ERROR;// this is not an error it should be a bool but would break backward compatibility
    return SQ_OK;
}